

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

QDomNodePrivate * __thiscall
QDomNamedNodeMapPrivate::setNamedItemNS(QDomNamedNodeMapPrivate *this,QDomNodePrivate *arg)

{
  int iVar1;
  undefined4 extraout_var;
  QDomNodePrivate *pQVar2;
  long in_FS_OFFSET;
  iterator iStack_58;
  QString local_40;
  QDomNodePrivate *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QDomNodePrivate *)0x0;
  local_28 = arg;
  if ((arg != (QDomNodePrivate *)0x0) && (this->readonly == false)) {
    if (this->appendToParent == true) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        iVar1 = (*this->parent->_vptr_QDomNodePrivate[7])(this->parent,arg);
        return (QDomNodePrivate *)CONCAT44(extraout_var,iVar1);
      }
      goto LAB_00110a45;
    }
    if ((arg->prefix).d.ptr == (char16_t *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pQVar2 = setNamedItem(this,arg);
        return pQVar2;
      }
      goto LAB_00110a45;
    }
    pQVar2 = namedItemNS(this,&arg->namespaceURI,&arg->name);
    LOCK();
    (arg->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (arg->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_40.d.d = (local_28->name).d.d;
    local_40.d.ptr = (local_28->name).d.ptr;
    local_40.d.size = (local_28->name).d.size;
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_40.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_40.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QMultiHash<QString,QDomNodePrivate*>::emplace<QDomNodePrivate*const&>
              (&iStack_58,&this->map,&local_40,&local_28);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar2;
  }
LAB_00110a45:
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomNamedNodeMapPrivate::setNamedItemNS(QDomNodePrivate* arg)
{
    if (readonly || !arg)
        return nullptr;

    if (appendToParent)
        return parent->appendChild(arg);

    if (!arg->prefix.isNull()) {
        // node has a namespace
        QDomNodePrivate *n = namedItemNS(arg->namespaceURI, arg->name);
        // We take a reference
        arg->ref.ref();
        map.insert(arg->nodeName(), arg);
        return n;
    } else {
        // ### check the following code if it is ok
        return setNamedItem(arg);
    }
}